

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O2

exr_result_t default_decompress_chunk(exr_decode_pipeline_t *decode)

{
  _internal_exr_context *pctxt;
  _internal_exr_part *p_Var1;
  exr_result_t eVar2;
  long lVar3;
  uint64_t uVar4;
  char *pcVar5;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  uint64_t unpacksz;
  
  pctxt = (_internal_exr_context *)decode->context;
  if (pctxt == (_internal_exr_context *)0x0) {
    return 2;
  }
  if (pctxt->mode != '\0') {
    eVar2 = (*pctxt->standard_error)(pctxt,7);
    return eVar2;
  }
  lVar3 = (long)decode->part_index;
  if ((lVar3 < 0) || (pctxt->num_parts <= decode->part_index)) {
    eVar2 = (*pctxt->print_error)(pctxt,4,"Part index (%d) out of range",lVar3,pctxt->print_error);
    return eVar2;
  }
  p_Var1 = pctxt->parts[lVar3];
  if ((p_Var1->storage_mode & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) {
    unpacksz = (long)(decode->chunk).height * (long)(decode->chunk).width * 4;
    eVar2 = decompress_data(pctxt,p_Var1->comp_type,decode,decode->packed_sample_count_table,
                            (decode->chunk).sample_count_table_size,decode->sample_count_table,
                            unpacksz);
    if (eVar2 != 0) {
      UNRECOVERED_JUMPTABLE = pctxt->print_error;
      uVar4 = (decode->chunk).sample_count_table_size;
      pcVar5 = "Unable to decompress sample table %lu -> %lu";
      goto LAB_0011f137;
    }
    if ((decode->decode_flags & 4) != 0) {
      return 0;
    }
  }
  eVar2 = decompress_data(pctxt,p_Var1->comp_type,decode,decode->packed_buffer,
                          (decode->chunk).packed_size,decode->unpacked_buffer,
                          (decode->chunk).unpacked_size);
  if (eVar2 == 0) {
    return 0;
  }
  UNRECOVERED_JUMPTABLE = pctxt->print_error;
  uVar4 = (decode->chunk).packed_size;
  unpacksz = (decode->chunk).unpacked_size;
  pcVar5 = "Unable to decompress image data %lu -> %lu";
LAB_0011f137:
  eVar2 = (*UNRECOVERED_JUMPTABLE)(pctxt,eVar2,pcVar5,uVar4,unpacksz,UNRECOVERED_JUMPTABLE);
  return eVar2;
}

Assistant:

static exr_result_t
default_decompress_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (
        decode->context, decode->part_index);

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        uint64_t sampsize =
            (((uint64_t) decode->chunk.width) *
             ((uint64_t) decode->chunk.height));
        sampsize *= sizeof (int32_t);

        rv = decompress_data (
            pctxt,
            part->comp_type,
            decode,
            decode->packed_sample_count_table,
            decode->chunk.sample_count_table_size,
            decode->sample_count_table,
            sampsize);

        if (rv != EXR_ERR_SUCCESS)
        {
            return pctxt->print_error (
                pctxt,
                rv,
                "Unable to decompress sample table %" PRIu64 " -> %" PRIu64,
                decode->chunk.sample_count_table_size,
                (uint64_t) sampsize);
        }
        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;
    }

    if (rv == EXR_ERR_SUCCESS)
        rv = decompress_data (
            pctxt,
            part->comp_type,
            decode,
            decode->packed_buffer,
            decode->chunk.packed_size,
            decode->unpacked_buffer,
            decode->chunk.unpacked_size);

    if (rv != EXR_ERR_SUCCESS)
    {
        return pctxt->print_error (
            pctxt,
            rv,
            "Unable to decompress image data %" PRIu64 " -> %" PRIu64,
            decode->chunk.packed_size,
            decode->chunk.unpacked_size);
    }
    return rv;
}